

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

void __thiscall RVO::Agent::computeNewVelocity(Agent *this)

{
  vector<RVO::Line,_std::allocator<RVO::Line>_> *this_00;
  pointer *ppLVar1;
  pointer pLVar2;
  pointer pLVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  pointer ppVar8;
  float *pfVar9;
  pointer ppVar10;
  size_t beginLine;
  long lVar11;
  Obstacle *pOVar12;
  iterator iVar13;
  ulong uVar14;
  Obstacle *pOVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float invS_1;
  float fVar21;
  float invS;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Line line;
  Line local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar2) {
    (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  this_00 = &this->orcaLines_;
  ppVar8 = (this->obstacleNeighbors_).
           super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obstacleNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar8) {
    fVar16 = 1.0 / this->timeHorizonObst_;
    local_78 = ZEXT416((uint)fVar16);
    local_58._4_4_ = 0x80000000;
    local_58._0_4_ = -fVar16;
    local_58._8_4_ = 0x80000000;
    local_58._12_4_ = 0x80000000;
    uVar14 = 0;
    do {
      pOVar15 = ppVar8[uVar14].second;
      pOVar12 = pOVar15->nextObstacle_;
      fVar16 = (pOVar15->point_).x_;
      fVar25 = (this->position_).x_;
      fVar17 = fVar16 - fVar25;
      _local_a8 = ZEXT416((uint)fVar17);
      fVar28 = (pOVar15->point_).y_;
      fVar23 = (this->position_).y_;
      fVar18 = fVar28 - fVar23;
      _local_d8 = ZEXT416((uint)fVar18);
      fVar21 = (pOVar12->point_).x_;
      fVar19 = (pOVar12->point_).y_;
      fVar25 = fVar21 - fVar25;
      local_e8 = ZEXT416((uint)fVar25);
      fVar23 = fVar19 - fVar23;
      local_b8 = ZEXT416((uint)fVar23);
      pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13._M_current =
           (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_finish;
      lVar11 = (long)iVar13._M_current - (long)pLVar2;
      auVar5 = _local_a8;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 4;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        pfVar9 = &(pLVar2->direction).y_;
        do {
          fVar30 = (float)local_58._0_4_ * this->radius_;
          if ((-1e-05 <= (((float)local_78._0_4_ * fVar17 - pfVar9[-3]) * *pfVar9 -
                         ((float)local_78._0_4_ * fVar18 - pfVar9[-2]) *
                         ((Vector2 *)(pfVar9 + -1))->x_) + fVar30) &&
             (-1e-05 <= fVar30 + (((float)local_78._0_4_ * fVar25 - pfVar9[-3]) * *pfVar9 -
                                 ((Vector2 *)(pfVar9 + -1))->x_ *
                                 ((float)local_78._0_4_ * fVar23 - pfVar9[-2])))) goto LAB_0010604c;
          pfVar9 = pfVar9 + 4;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      fVar30 = fVar17 * fVar17 + fVar18 * fVar18;
      fVar27 = this->radius_ * this->radius_;
      fVar21 = fVar21 - fVar16;
      fVar19 = fVar19 - fVar28;
      fVar28 = -fVar17;
      fVar16 = -fVar18;
      fVar22 = (fVar28 * fVar21 - fVar19 * fVar18) / (fVar21 * fVar21 + fVar19 * fVar19);
      local_f8.point.x_ = 0.0;
      local_f8.point.y_ = 0.0;
      local_f8.direction.x_ = 0.0;
      local_f8.direction.y_ = 0.0;
      if ((fVar22 < 0.0) && (fVar30 <= fVar27)) {
        if (pOVar15->isConvex_ != true) goto LAB_0010604c;
        local_f8.point.x_ = 0.0;
        local_f8.point.y_ = 0.0;
        if (fVar30 < 0.0) {
          local_88._4_4_ = 0x80000000;
          local_88._0_4_ = fVar16;
          local_88._8_4_ = 0x80000000;
          local_88._12_4_ = 0x80000000;
          fVar30 = sqrtf(fVar30);
          fVar16 = (float)local_88._0_4_;
        }
        else {
          fVar30 = SQRT(fVar30);
        }
        local_f8.direction.y_ = (float)local_a8._0_4_ * (1.0 / fVar30);
        local_f8.direction.x_ = (1.0 / fVar30) * fVar16;
        goto LAB_00106020;
      }
      fVar24 = fVar25 * fVar25 + fVar23 * fVar23;
      if ((1.0 < fVar22) && (fVar24 <= fVar27)) {
        if ((pOVar12->isConvex_ == true) &&
           (0.0 <= (pOVar12->unitDir_).y_ * fVar25 - (pOVar12->unitDir_).x_ * fVar23)) {
          local_f8.point.x_ = 0.0;
          local_f8.point.y_ = 0.0;
          if (fVar24 < 0.0) {
            fVar24 = sqrtf(fVar24);
          }
          else {
            fVar24 = SQRT(fVar24);
          }
          local_f8.direction.y_ = (float)local_e8._0_4_ * (1.0 / fVar24);
          local_f8.direction.x_ = -(float)local_b8._0_4_ * (1.0 / fVar24);
          goto LAB_00106020;
        }
        goto LAB_0010604c;
      }
      fVar23 = fVar28 - fVar21 * fVar22;
      fVar25 = fVar16 - fVar19 * fVar22;
      fVar25 = fVar23 * fVar23 + fVar25 * fVar25;
      if (((fVar22 < 0.0) || (1.0 <= fVar22)) || (fVar27 < fVar25)) {
        if ((0.0 <= fVar22) || (fVar27 < fVar25)) {
          if ((fVar22 <= 1.0) || (fVar27 < fVar25)) {
            if (pOVar15->isConvex_ == true) {
              fVar25 = fVar30 - fVar27;
              if (fVar25 < 0.0) {
                local_98._0_4_ = fVar24;
                local_68 = ZEXT416((uint)fVar30);
                local_88._4_4_ = 0x80000000;
                local_88._0_4_ = fVar16;
                local_88._8_4_ = 0x80000000;
                local_88._12_4_ = 0x80000000;
                local_bc = fVar27;
                fVar25 = sqrtf(fVar25);
                fVar24 = (float)local_98._0_4_;
                fVar16 = (float)local_88._0_4_;
                fVar30 = (float)local_68._0_4_;
                fVar27 = local_bc;
              }
              else {
                fVar25 = SQRT(fVar25);
                local_a8 = (undefined1  [8])(ulong)(uint)fVar17;
              }
              fVar28 = (float)local_a8._0_4_ * this->radius_;
              uStack_9c = 0;
              local_a8._0_4_ =
                   ((float)local_a8._0_4_ * fVar25 + this->radius_ * fVar16) * (1.0 / fVar30);
              fVar16 = (1.0 / fVar30) * (fVar28 + (float)local_d8._0_4_ * fVar25);
              uStack_a0 = local_a8._4_4_;
            }
            else {
              uStack_9c = 0x80000000;
              local_a8._0_4_ = -(pOVar15->unitDir_).x_;
              fVar16 = -(pOVar15->unitDir_).y_;
              uStack_a0 = uStack_9c;
            }
            if (pOVar12->isConvex_ == true) {
              fVar27 = fVar24 - fVar27;
              if (fVar27 < 0.0) {
                local_a8._4_4_ = fVar16;
                local_98._0_4_ = fVar24;
                fVar27 = sqrtf(fVar27);
                fVar24 = (float)local_98._0_4_;
                fVar16 = (float)local_a8._4_4_;
              }
              else {
                fVar27 = SQRT(fVar27);
              }
              local_d8._4_4_ =
                   (1.0 / fVar24) *
                   ((float)local_b8._0_4_ * fVar27 - (float)local_e8._0_4_ * this->radius_);
              local_d8._0_4_ =
                   ((float)local_e8._0_4_ * fVar27 + (float)local_b8._0_4_ * this->radius_) *
                   (1.0 / fVar24);
              uStack_d0 = local_e8._4_4_;
              uStack_cc = 0;
            }
            else {
              _uStack_d0 = 0;
              local_d8._0_4_ = (pOVar15->unitDir_).x_;
              local_d8._4_4_ = (pOVar15->unitDir_).y_;
            }
          }
          else {
            if (pOVar12->isConvex_ != true) goto LAB_0010604c;
            fVar27 = fVar24 - fVar27;
            if (fVar27 < 0.0) {
              local_98._0_4_ = fVar24;
              fVar27 = sqrtf(fVar27);
              fVar24 = (float)local_98._0_4_;
            }
            else {
              fVar27 = SQRT(fVar27);
            }
            fVar28 = (float)local_b8._0_4_ * this->radius_;
            fVar25 = (float)local_e8._0_4_ * this->radius_;
            fVar24 = 1.0 / fVar24;
            local_a8._0_4_ = ((float)local_e8._0_4_ * fVar27 - fVar28) * fVar24;
            fVar16 = (fVar25 + (float)local_b8._0_4_ * fVar27) * fVar24;
            local_d8._4_4_ = ((float)local_b8._0_4_ * fVar27 - fVar25) * fVar24;
            local_d8._0_4_ = (fVar28 + (float)local_e8._0_4_ * fVar27) * fVar24;
            uStack_d0 = local_b8._4_4_;
            uStack_cc = local_b8._4_4_;
            pOVar15 = pOVar12;
          }
        }
        else {
          if (pOVar15->isConvex_ != true) goto LAB_0010604c;
          fVar27 = fVar30 - fVar27;
          if (fVar27 < 0.0) {
            local_68 = ZEXT416((uint)fVar30);
            local_88._4_4_ = 0x80000000;
            local_88._0_4_ = fVar16;
            local_88._8_4_ = 0x80000000;
            local_88._12_4_ = 0x80000000;
            local_b8._4_4_ = 0x80000000;
            local_b8._0_4_ = fVar28;
            local_b8._8_4_ = 0x80000000;
            local_b8._12_4_ = 0x80000000;
            fVar27 = sqrtf(fVar27);
            fVar16 = (float)local_88._0_4_;
            fVar30 = (float)local_68._0_4_;
            fVar28 = (float)local_b8._0_4_;
            uStack_cc = local_b8._4_4_;
          }
          else {
            fVar27 = SQRT(fVar27);
            uStack_cc = 0x80000000;
            local_d8 = (undefined1  [8])(ulong)(uint)fVar18;
          }
          fVar25 = this->radius_;
          fVar23 = (float)local_a8._0_4_ * fVar27;
          uStack_d0 = local_d8._4_4_;
          fVar21 = (float)local_a8._0_4_ * fVar25;
          fVar30 = 1.0 / fVar30;
          local_a8._0_4_ = (fVar25 * fVar16 + fVar23) * fVar30;
          fVar16 = (fVar21 + fVar27 * (float)local_d8._0_4_) * fVar30;
          local_d8._4_4_ = (fVar28 * fVar25 + fVar27 * (float)local_d8._0_4_) * fVar30;
          local_d8._0_4_ = ((float)local_d8._0_4_ * fVar25 + fVar23) * fVar30;
          pOVar12 = pOVar15;
        }
        if (pOVar15->isConvex_ == true) {
          fVar25 = (pOVar15->prevObstacle_->unitDir_).x_;
          fVar28 = (pOVar15->prevObstacle_->unitDir_).y_;
          if (fVar16 * fVar25 - (float)local_a8._0_4_ * fVar28 < 0.0) goto LAB_00105db1;
          fVar16 = -fVar28;
          local_a8._0_4_ = -fVar25;
          bVar7 = true;
        }
        else {
LAB_00105db1:
          bVar7 = false;
        }
        if (pOVar12->isConvex_ == true) {
          if (0.0 < (pOVar12->unitDir_).y_ * (float)local_d8._0_4_ -
                    (float)local_d8._4_4_ * (pOVar12->unitDir_).x_) goto LAB_00105df5;
          _uStack_d0 = 0;
          local_d8._0_4_ = (pOVar12->unitDir_).x_;
          local_d8._4_4_ = (pOVar12->unitDir_).y_;
          bVar6 = true;
        }
        else {
LAB_00105df5:
          bVar6 = false;
        }
        fVar25 = (this->position_).x_;
        fVar28 = (this->position_).y_;
        fVar21 = ((pOVar15->point_).x_ - fVar25) * (float)local_78._0_4_;
        fVar19 = ((pOVar15->point_).y_ - fVar28) * (float)local_78._0_4_;
        fVar23 = ((pOVar12->point_).x_ - fVar25) * (float)local_78._0_4_;
        fVar25 = ((pOVar12->point_).y_ - fVar28) * (float)local_78._0_4_;
        fVar28 = fVar23 - fVar21;
        fVar17 = fVar25 - fVar19;
        fVar18 = 0.5;
        if (pOVar15 != pOVar12) {
          fVar18 = (((this->velocity_).x_ - fVar21) * fVar28 +
                   ((this->velocity_).y_ - fVar19) * fVar17) / (fVar28 * fVar28 + fVar17 * fVar17);
        }
        fVar30 = (this->velocity_).x_;
        fVar27 = (this->velocity_).y_;
        fVar22 = fVar30 - fVar21;
        local_e8 = ZEXT416((uint)fVar19);
        fVar29 = fVar27 - fVar19;
        local_b8._0_4_ = fVar29;
        auVar5 = ZEXT416((uint)fVar22);
        fVar24 = fVar22 * (float)local_a8._0_4_ + fVar16 * fVar29;
        _local_a8 = auVar5;
        if ((fVar18 < 0.0) && (fVar24 < 0.0)) {
LAB_00105f85:
          fVar16 = fVar22 * fVar22 + fVar29 * fVar29;
          if (fVar16 < 0.0) {
            _local_d8 = ZEXT416((uint)fVar21);
            fVar16 = sqrtf(fVar16);
            fVar21 = (float)local_d8._0_4_;
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          fVar25 = (float)local_a8._0_4_ * (1.0 / fVar16);
          fVar28 = (float)local_b8._0_4_ * (1.0 / fVar16);
          local_f8.direction = (Vector2)(CONCAT44(fVar25,fVar28) ^ 0x8000000000000000);
          fVar16 = this->radius_ * (float)local_78._0_4_;
          fVar21 = fVar21 + fVar25 * fVar16;
          fVar19 = (float)local_e8._0_4_ + fVar16 * fVar28;
LAB_0010601b:
          local_f8.point.y_ = fVar19;
          local_f8.point.x_ = fVar21;
LAB_00106020:
          iVar13._M_current =
               (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
               super__Vector_impl_data._M_finish;
          goto LAB_00106024;
        }
        fVar20 = fVar30 - fVar23;
        local_bc = fVar27 - fVar25;
        local_88 = ZEXT416((uint)fVar23);
        local_98 = ZEXT416((uint)fVar25);
        local_48 = (float)local_d8._4_4_;
        fStack_44 = (float)local_d8._4_4_;
        fStack_40 = (float)local_d8._4_4_;
        fStack_3c = (float)local_d8._4_4_;
        local_68 = ZEXT416((uint)fVar20);
        fVar26 = fVar20 * (float)local_d8._0_4_ + (float)local_d8._4_4_ * local_bc;
        if ((fVar26 < 0.0) && ((pOVar15 == pOVar12 && (fVar24 < 0.0)))) goto LAB_00105f85;
        if ((1.0 < fVar18) && (fVar26 < 0.0)) {
          fVar16 = fVar20 * fVar20 + local_bc * local_bc;
          if (fVar16 < 0.0) {
            fVar16 = sqrtf(fVar16);
            fVar25 = (float)local_98._0_4_;
            fVar23 = (float)local_88._0_4_;
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          fVar28 = (float)local_68._0_4_ * (1.0 / fVar16);
          fVar21 = local_bc * (1.0 / fVar16);
          local_f8.direction = (Vector2)(CONCAT44(fVar28,fVar21) ^ 0x8000000000000000);
          fVar16 = this->radius_ * (float)local_78._0_4_;
          local_f8.point.y_ = fVar25 + fVar16 * fVar21;
          local_f8.point.x_ = fVar23 + fVar28 * fVar16;
          goto LAB_00106020;
        }
        fVar22 = INFINITY;
        if (((pOVar15 != pOVar12) && (fVar22 = INFINITY, 0.0 <= fVar18)) &&
           (fVar22 = INFINITY, fVar18 <= 1.0)) {
          fVar22 = fVar30 - (fVar28 * fVar18 + fVar21);
          fVar28 = fVar27 - (fVar17 * fVar18 + fVar19);
          fVar22 = fVar22 * fVar22 + fVar28 * fVar28;
        }
        fVar28 = INFINITY;
        if (0.0 <= fVar24) {
          fVar28 = fVar30 - ((float)local_a8._0_4_ * fVar24 + fVar21);
          fVar17 = fVar27 - (fVar16 * fVar24 + fVar19);
          fVar28 = fVar28 * fVar28 + fVar17 * fVar17;
        }
        fVar17 = INFINITY;
        if (0.0 <= fVar26) {
          fVar30 = fVar30 - ((float)local_d8._0_4_ * fVar26 + fVar23);
          fVar27 = fVar27 - ((float)local_d8._4_4_ * fVar26 + fVar25);
          fVar17 = fVar30 * fVar30 + fVar27 * fVar27;
        }
        if ((fVar22 <= fVar28) && (fVar22 <= fVar17)) {
          local_f8.direction = (Vector2)((ulong)pOVar15->unitDir_ ^ 0x8000000080000000);
          fVar16 = this->radius_ * (float)local_78._0_4_;
          fVar21 = fVar21 - fVar16 * local_f8.direction.y_;
          fVar19 = fVar19 + local_f8.direction.x_ * fVar16;
          goto LAB_0010601b;
        }
        if (fVar28 <= fVar17) {
          if (!bVar7) {
            local_f8.direction.y_ = fVar16;
            local_f8.direction.x_ = (float)local_a8._0_4_;
            fVar25 = this->radius_ * (float)local_78._0_4_;
            fVar21 = fVar21 - fVar25 * fVar16;
            fVar19 = fVar19 + (float)local_a8._0_4_ * fVar25;
            goto LAB_0010601b;
          }
        }
        else if (!bVar6) {
          local_f8.direction = (Vector2)(local_d8 ^ 0x8000000080000000);
          fVar16 = this->radius_ * (float)local_78._0_4_;
          local_f8.point.y_ = fVar25 + -(float)local_d8._0_4_ * fVar16;
          local_f8.point.x_ = fVar23 - fVar16 * -(float)local_d8._4_4_;
          goto LAB_00106020;
        }
      }
      else {
        local_f8.point.x_ = 0.0;
        local_f8.point.y_ = 0.0;
        local_f8.direction = (Vector2)((ulong)pOVar15->unitDir_ ^ 0x8000000080000000);
LAB_00106024:
        if (iVar13._M_current ==
            (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                    ((vector<RVO::Line,std::allocator<RVO::Line>> *)this_00,iVar13,&local_f8);
          auVar5 = _local_a8;
        }
        else {
          (iVar13._M_current)->point = local_f8.point;
          (iVar13._M_current)->direction = local_f8.direction;
          ppLVar1 = &(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
          auVar5 = _local_a8;
        }
      }
LAB_0010604c:
      _local_a8 = auVar5;
      uVar14 = uVar14 + 1;
      ppVar8 = (this->obstacleNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->obstacleNeighbors_).
                                    super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 4))
    ;
  }
  pLVar2 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar3 = (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar10 = (this->agentNeighbors_).
            super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->agentNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    local_b8._0_4_ = 1.0 / this->timeHorizon_;
    lVar11 = 8;
    uVar14 = 0;
    do {
      lVar4 = *(long *)((long)&ppVar10->first + lVar11);
      fVar23 = *(float *)(lVar4 + 0x60) - (this->position_).x_;
      fVar19 = *(float *)(lVar4 + 100) - (this->position_).y_;
      fVar25 = (this->velocity_).x_ - *(float *)(lVar4 + 0x88);
      fVar28 = (this->velocity_).y_ - *(float *)(lVar4 + 0x8c);
      fVar21 = fVar23 * fVar23 + fVar19 * fVar19;
      fVar16 = this->radius_ + *(float *)(lVar4 + 0x70);
      fVar17 = fVar16 * fVar16;
      local_f8.point.x_ = 0.0;
      local_f8.point.y_ = 0.0;
      local_f8.direction.x_ = 0.0;
      local_f8.direction.y_ = 0.0;
      if (fVar21 <= fVar17) {
        fVar21 = 1.0 / this->sim_->timeStep_;
        fVar25 = fVar25 - fVar23 * fVar21;
        fVar28 = fVar28 - fVar19 * fVar21;
        fVar18 = fVar25 * fVar25 + fVar28 * fVar28;
        if (fVar18 < 0.0) {
          local_58 = ZEXT416((uint)fVar16);
          _local_a8 = ZEXT416((uint)fVar25);
          local_d8._0_4_ = fVar28;
          local_e8._0_4_ = fVar21;
          fVar18 = sqrtf(fVar18);
          fVar21 = (float)local_e8._0_4_;
          fVar16 = (float)local_58._0_4_;
          fVar25 = (float)local_a8._0_4_;
          fVar28 = (float)local_d8._0_4_;
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar25 = fVar25 * (1.0 / fVar18);
        fVar28 = (1.0 / fVar18) * fVar28;
        local_f8.direction = (Vector2)(CONCAT44(fVar25,fVar28) ^ 0x8000000000000000);
        fVar18 = fVar16 * fVar21 - fVar18;
        fVar30 = fVar25 * fVar18;
        fVar18 = fVar18 * fVar28;
      }
      else {
        fVar30 = fVar25 - (float)local_b8._0_4_ * fVar23;
        fVar27 = fVar28 - (float)local_b8._0_4_ * fVar19;
        fVar22 = fVar30 * fVar23 + fVar19 * fVar27;
        if ((0.0 <= fVar22) ||
           (fVar18 = fVar30 * fVar30 + fVar27 * fVar27, fVar22 * fVar22 <= fVar17 * fVar18)) {
          fVar17 = fVar21 - fVar17;
          if (fVar17 < 0.0) {
            local_58 = ZEXT416((uint)fVar16);
            _local_a8 = ZEXT416((uint)fVar25);
            local_d8._0_4_ = fVar28;
            local_88._0_4_ = fVar23;
            local_e8 = ZEXT416((uint)fVar30);
            local_98._0_4_ = fVar21;
            local_68 = ZEXT416((uint)fVar19);
            local_78._0_4_ = fVar27;
            fVar17 = sqrtf(fVar17);
            fVar16 = (float)local_58._0_4_;
            fVar25 = (float)local_a8._0_4_;
            fVar28 = (float)local_d8._0_4_;
            fVar23 = (float)local_88._0_4_;
            fVar30 = (float)local_e8._0_4_;
            fVar21 = (float)local_98._0_4_;
            fVar19 = (float)local_68._0_4_;
            fVar27 = (float)local_78._0_4_;
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          if (fVar27 * fVar23 - fVar30 * fVar19 <= 0.0) {
            fVar18 = -(fVar23 * fVar17 + fVar19 * fVar16);
            fVar16 = -(fVar17 * fVar19 - fVar23 * fVar16);
          }
          else {
            fVar18 = fVar23 * fVar17 + -fVar19 * fVar16;
            fVar16 = fVar23 * fVar16 + fVar17 * fVar19;
          }
          fVar18 = fVar18 * (1.0 / fVar21);
          fVar16 = (1.0 / fVar21) * fVar16;
          local_f8.direction.y_ = fVar16;
          local_f8.direction.x_ = fVar18;
          fVar23 = fVar25 * fVar18 + fVar28 * fVar16;
          fVar30 = fVar18 * fVar23 - fVar25;
          fVar18 = fVar23 * fVar16 - fVar28;
        }
        else {
          if (fVar18 < 0.0) {
            local_58 = ZEXT416((uint)fVar16);
            local_e8 = ZEXT416((uint)fVar30);
            local_78._0_4_ = fVar27;
            fVar18 = sqrtf(fVar18);
            fVar16 = (float)local_58._0_4_;
            fVar30 = (float)local_e8._0_4_;
            fVar27 = (float)local_78._0_4_;
          }
          else {
            fVar18 = SQRT(fVar18);
          }
          fVar30 = fVar30 * (1.0 / fVar18);
          fVar27 = fVar27 * (1.0 / fVar18);
          local_f8.direction = (Vector2)(CONCAT44(fVar30,fVar27) ^ 0x8000000000000000);
          fVar18 = fVar16 * (float)local_b8._0_4_ - fVar18;
          fVar30 = fVar30 * fVar18;
          fVar18 = fVar18 * fVar27;
        }
      }
      local_f8.point.y_ = fVar18 * 0.5 + (this->velocity_).y_;
      local_f8.point.x_ = fVar30 * 0.5 + (this->velocity_).x_;
      iVar13._M_current =
           (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<RVO::Line,std::allocator<RVO::Line>>::_M_realloc_insert<RVO::Line_const&>
                  ((vector<RVO::Line,std::allocator<RVO::Line>> *)this_00,iVar13,&local_f8);
      }
      else {
        (iVar13._M_current)->point = local_f8.point;
        (iVar13._M_current)->direction = local_f8.direction;
        ppLVar1 = &(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      uVar14 = uVar14 + 1;
      ppVar10 = (this->agentNeighbors_).
                super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar14 < (ulong)((long)(this->agentNeighbors_).
                                    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 4)
            );
  }
  beginLine = linearProgram2(this_00,this->maxSpeed_,&this->prefVelocity_,false,&this->newVelocity_)
  ;
  if (beginLine <
      (ulong)((long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->orcaLines_).super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    linearProgram3(this_00,(long)pLVar2 - (long)pLVar3 >> 4,beginLine,this->maxSpeed_,
                   &this->newVelocity_);
  }
  return;
}

Assistant:

void Agent::computeNewVelocity()
	{
		orcaLines_.clear();

		const float invTimeHorizonObst = 1.0f / timeHorizonObst_;

		/* Create obstacle ORCA lines. */
		for (size_t i = 0; i < obstacleNeighbors_.size(); ++i) {

			const Obstacle *obstacle1 = obstacleNeighbors_[i].second;
			const Obstacle *obstacle2 = obstacle1->nextObstacle_;

			const Vector2 relativePosition1 = obstacle1->point_ - position_;
			const Vector2 relativePosition2 = obstacle2->point_ - position_;

			/*
			 * Check if velocity obstacle of obstacle is already taken care of by
			 * previously constructed obstacle ORCA lines.
			 */
			bool alreadyCovered = false;

			for (size_t j = 0; j < orcaLines_.size(); ++j) {
				if (det(invTimeHorizonObst * relativePosition1 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >= -RVO_EPSILON && det(invTimeHorizonObst * relativePosition2 - orcaLines_[j].point, orcaLines_[j].direction) - invTimeHorizonObst * radius_ >=  -RVO_EPSILON) {
					alreadyCovered = true;
					break;
				}
			}

			if (alreadyCovered) {
				continue;
			}

			/* Not yet covered. Check for collisions. */

			const float distSq1 = absSq(relativePosition1);
			const float distSq2 = absSq(relativePosition2);

			const float radiusSq = sqr(radius_);

			const Vector2 obstacleVector = obstacle2->point_ - obstacle1->point_;
			const float s = (-relativePosition1 * obstacleVector) / absSq(obstacleVector);
			const float distSqLine = absSq(-relativePosition1 - s * obstacleVector);

			Line line;

			if (s < 0.0f && distSq1 <= radiusSq) {
				/* Collision with left vertex. Ignore if non-convex. */
				if (obstacle1->isConvex_) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition1.y(), relativePosition1.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s > 1.0f && distSq2 <= radiusSq) {
				/* Collision with right vertex. Ignore if non-convex
				 * or if it will be taken care of by neighoring obstace */
				if (obstacle2->isConvex_ && det(relativePosition2, obstacle2->unitDir_) >= 0.0f) {
					line.point = Vector2(0.0f, 0.0f);
					line.direction = normalize(Vector2(-relativePosition2.y(), relativePosition2.x()));
					orcaLines_.push_back(line);
				}

				continue;
			}
			else if (s >= 0.0f && s < 1.0f && distSqLine <= radiusSq) {
				/* Collision with obstacle segment. */
				line.point = Vector2(0.0f, 0.0f);
				line.direction = -obstacle1->unitDir_;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * No collision.
			 * Compute legs. When obliquely viewed, both legs can come from a single
			 * vertex. Legs extend cut-off line when nonconvex vertex.
			 */

			Vector2 leftLegDirection, rightLegDirection;

			if (s < 0.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that left vertex
				 * defines velocity obstacle.
				 */
				if (!obstacle1->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle2 = obstacle1;

				const float leg1 = std::sqrt(distSq1 - radiusSq);
				leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				rightLegDirection = Vector2(relativePosition1.x() * leg1 + relativePosition1.y() * radius_, -relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
			}
			else if (s > 1.0f && distSqLine <= radiusSq) {
				/*
				 * Obstacle viewed obliquely so that
				 * right vertex defines velocity obstacle.
				 */
				if (!obstacle2->isConvex_) {
					/* Ignore obstacle. */
					continue;
				}

				obstacle1 = obstacle2;

				const float leg2 = std::sqrt(distSq2 - radiusSq);
				leftLegDirection = Vector2(relativePosition2.x() * leg2 - relativePosition2.y() * radius_, relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
			}
			else {
				/* Usual situation. */
				if (obstacle1->isConvex_) {
					const float leg1 = std::sqrt(distSq1 - radiusSq);
					leftLegDirection = Vector2(relativePosition1.x() * leg1 - relativePosition1.y() * radius_, relativePosition1.x() * radius_ + relativePosition1.y() * leg1) / distSq1;
				}
				else {
					/* Left vertex non-convex; left leg extends cut-off line. */
					leftLegDirection = -obstacle1->unitDir_;
				}

				if (obstacle2->isConvex_) {
					const float leg2 = std::sqrt(distSq2 - radiusSq);
					rightLegDirection = Vector2(relativePosition2.x() * leg2 + relativePosition2.y() * radius_, -relativePosition2.x() * radius_ + relativePosition2.y() * leg2) / distSq2;
				}
				else {
					/* Right vertex non-convex; right leg extends cut-off line. */
					rightLegDirection = obstacle1->unitDir_;
				}
			}

			/*
			 * Legs can never point into neighboring edge when convex vertex,
			 * take cutoff-line of neighboring edge instead. If velocity projected on
			 * "foreign" leg, no constraint is added.
			 */

			const Obstacle *const leftNeighbor = obstacle1->prevObstacle_;

			bool isLeftLegForeign = false;
			bool isRightLegForeign = false;

			if (obstacle1->isConvex_ && det(leftLegDirection, -leftNeighbor->unitDir_) >= 0.0f) {
				/* Left leg points into obstacle. */
				leftLegDirection = -leftNeighbor->unitDir_;
				isLeftLegForeign = true;
			}

			if (obstacle2->isConvex_ && det(rightLegDirection, obstacle2->unitDir_) <= 0.0f) {
				/* Right leg points into obstacle. */
				rightLegDirection = obstacle2->unitDir_;
				isRightLegForeign = true;
			}

			/* Compute cut-off centers. */
			const Vector2 leftCutoff = invTimeHorizonObst * (obstacle1->point_ - position_);
			const Vector2 rightCutoff = invTimeHorizonObst * (obstacle2->point_ - position_);
			const Vector2 cutoffVec = rightCutoff - leftCutoff;

			/* Project current velocity on velocity obstacle. */

			/* Check if current velocity is projected on cutoff circles. */
			const float t = (obstacle1 == obstacle2 ? 0.5f : ((velocity_ - leftCutoff) * cutoffVec) / absSq(cutoffVec));
			const float tLeft = ((velocity_ - leftCutoff) * leftLegDirection);
			const float tRight = ((velocity_ - rightCutoff) * rightLegDirection);

			if ((t < 0.0f && tLeft < 0.0f) || (obstacle1 == obstacle2 && tLeft < 0.0f && tRight < 0.0f)) {
				/* Project on left cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - leftCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = leftCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}
			else if (t > 1.0f && tRight < 0.0f) {
				/* Project on right cut-off circle. */
				const Vector2 unitW = normalize(velocity_ - rightCutoff);

				line.direction = Vector2(unitW.y(), -unitW.x());
				line.point = rightCutoff + radius_ * invTimeHorizonObst * unitW;
				orcaLines_.push_back(line);
				continue;
			}

			/*
			 * Project on left leg, right leg, or cut-off line, whichever is closest
			 * to velocity.
			 */
			const float distSqCutoff = ((t < 0.0f || t > 1.0f || obstacle1 == obstacle2) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + t * cutoffVec)));
			const float distSqLeft = ((tLeft < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (leftCutoff + tLeft * leftLegDirection)));
			const float distSqRight = ((tRight < 0.0f) ? std::numeric_limits<float>::infinity() : absSq(velocity_ - (rightCutoff + tRight * rightLegDirection)));

			if (distSqCutoff <= distSqLeft && distSqCutoff <= distSqRight) {
				/* Project on cut-off line. */
				line.direction = -obstacle1->unitDir_;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else if (distSqLeft <= distSqRight) {
				/* Project on left leg. */
				if (isLeftLegForeign) {
					continue;
				}

				line.direction = leftLegDirection;
				line.point = leftCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
			else {
				/* Project on right leg. */
				if (isRightLegForeign) {
					continue;
				}

				line.direction = -rightLegDirection;
				line.point = rightCutoff + radius_ * invTimeHorizonObst * Vector2(-line.direction.y(), line.direction.x());
				orcaLines_.push_back(line);
				continue;
			}
		}

		const size_t numObstLines = orcaLines_.size();

		const float invTimeHorizon = 1.0f / timeHorizon_;

		/* Create agent ORCA lines. */
		for (size_t i = 0; i < agentNeighbors_.size(); ++i) {
			const Agent *const other = agentNeighbors_[i].second;

			const Vector2 relativePosition = other->position_ - position_;
			const Vector2 relativeVelocity = velocity_ - other->velocity_;
			const float distSq = absSq(relativePosition);
			const float combinedRadius = radius_ + other->radius_;
			const float combinedRadiusSq = sqr(combinedRadius);

			Line line;
			Vector2 u;

			if (distSq > combinedRadiusSq) {
				/* No collision. */
				const Vector2 w = relativeVelocity - invTimeHorizon * relativePosition;
				/* Vector from cutoff center to relative velocity. */
				const float wLengthSq = absSq(w);

				const float dotProduct1 = w * relativePosition;

				if (dotProduct1 < 0.0f && sqr(dotProduct1) > combinedRadiusSq * wLengthSq) {
					/* Project on cut-off circle. */
					const float wLength = std::sqrt(wLengthSq);
					const Vector2 unitW = w / wLength;

					line.direction = Vector2(unitW.y(), -unitW.x());
					u = (combinedRadius * invTimeHorizon - wLength) * unitW;
				}
				else {
					/* Project on legs. */
					const float leg = std::sqrt(distSq - combinedRadiusSq);

					if (det(relativePosition, w) > 0.0f) {
						/* Project on left leg. */
						line.direction = Vector2(relativePosition.x() * leg - relativePosition.y() * combinedRadius, relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}
					else {
						/* Project on right leg. */
						line.direction = -Vector2(relativePosition.x() * leg + relativePosition.y() * combinedRadius, -relativePosition.x() * combinedRadius + relativePosition.y() * leg) / distSq;
					}

					const float dotProduct2 = relativeVelocity * line.direction;

					u = dotProduct2 * line.direction - relativeVelocity;
				}
			}
			else {
				/* Collision. Project on cut-off circle of time timeStep. */
				const float invTimeStep = 1.0f / sim_->timeStep_;

				/* Vector from cutoff center to relative velocity. */
				const Vector2 w = relativeVelocity - invTimeStep * relativePosition;

				const float wLength = abs(w);
				const Vector2 unitW = w / wLength;

				line.direction = Vector2(unitW.y(), -unitW.x());
				u = (combinedRadius * invTimeStep - wLength) * unitW;
			}

			line.point = velocity_ + 0.5f * u;
			orcaLines_.push_back(line);
		}

		size_t lineFail = linearProgram2(orcaLines_, maxSpeed_, prefVelocity_, false, newVelocity_);

		if (lineFail < orcaLines_.size()) {
			linearProgram3(orcaLines_, numObstLines, lineFail, maxSpeed_, newVelocity_);
		}
	}